

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineno.cpp
# Opt level: O0

int __thiscall Lineno::getNextChar(Lineno *this,char *buffer,int maxBuffer)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  int SUCCESS;
  int FAIL;
  int maxBuffer_local;
  char *buffer_local;
  Lineno *this_local;
  
  uVar1 = this->pos_;
  uVar3 = std::__cxx11::string::size();
  if ((uVar1 < uVar3) || (bVar2 = getNextLine(this), bVar2)) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->line_);
    *buffer = *pcVar4;
    this->pos_ = this->pos_ + 1;
    this_local._4_4_ = (uint)(*buffer != '\0');
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int  Lineno::getNextChar(char* buffer, int maxBuffer) {
    const int FAIL    = 0;
    const int SUCCESS = 1;

    // if at the line's end, then try to get the next line
    if ( pos_ >= line_.size() ) {
        if ( ! getNextLine() ) {
            return FAIL;
        }
    }

    // read the next character
    buffer[0] = line_[pos_];
    ++pos_;

    // assert that the character we get is not 0('\0');
    return (buffer[0] == 0) ? FAIL : SUCCESS;
}